

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O0

void __thiscall Dinic_LargeFlow_Test::TestBody(Dinic_LargeFlow_Test *this)

{
  bool bVar1;
  Flow lhs;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  int local_84;
  undefined1 local_80 [4];
  int i;
  Dinic d;
  Dinic_LargeFlow_Test *this_local;
  
  d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Dinic::Dinic((Dinic *)local_80,2);
  for (local_84 = 0; local_84 < 100; local_84 = local_84 + 1) {
    Dinic::addEdge((Dinic *)local_80,0,1,100000000000);
  }
  lhs = Dinic::getFlow((Dinic *)local_80,0,1);
  testing::internal::EqHelper<false>::Compare
            ((EqHelper<false> *)local_a8,"d.getFlow(0, 1)","10000000000000ll",lhs,10000000000000);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/dinic_test.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  Dinic::~Dinic((Dinic *)local_80);
  return;
}

Assistant:

TEST(Dinic, LargeFlow) {
    Dinic d(2);
    rep(i, 0, 100) {
        d.addEdge(0, 1, 100000000000ll);
    }
    EXPECT_EQ(d.getFlow(0, 1), 10000000000000ll);
}